

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O1

StructValues<wasm::LUBFinder> * __thiscall
wasm::StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
          (StructValuesMap<wasm::LUBFinder> *this,HeapType type)

{
  bool bVar1;
  Struct *pSVar2;
  __hashtable *__h;
  vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_false,_true>,_bool>
  pVar3;
  uintptr_t local_58;
  vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> local_50;
  vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> local_38;
  HeapType local_20;
  HeapType type_local;
  
  local_20.id = type.id;
  bVar1 = HeapType::isStruct(&local_20);
  if (bVar1) {
    local_38.super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58 = local_20.id;
    std::vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>::vector(&local_50,&local_38);
    pVar3 = std::
            _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::LUBFinder>>,std::allocator<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::LUBFinder>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::LUBFinder>>>
                      ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::LUBFinder>>,std::allocator<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::LUBFinder>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)this,&local_58);
    if (local_50.super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_38.super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    this_00 = (vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> *)
              ((long)pVar3.first.
                     super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_true>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_true>
              + 0x10);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pSVar2 = HeapType::getStruct(&local_20);
      std::vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>::resize
                (this_00,(long)(pSVar2->fields).
                               super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)(pSVar2->fields).
                               super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
                               .super__Vector_impl_data._M_start >> 4);
    }
    return (StructValues<wasm::LUBFinder> *)this_00;
  }
  __assert_fail("type.isStruct()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/struct-utils.h"
                ,0x35,
                "StructValues<T> &wasm::StructUtils::StructValuesMap<wasm::LUBFinder>::operator[](HeapType) [T = wasm::LUBFinder]"
               );
}

Assistant:

StructValues<T>& operator[](HeapType type) {
    assert(type.isStruct());
    auto inserted = this->insert({type, {}});
    auto& values = inserted.first->second;
    if (inserted.second) {
      values.resize(type.getStruct().fields.size());
    }
    return values;
  }